

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QStyleSheetBorderData::QStyleSheetBorderData
          (QStyleSheetBorderData *this,int *b,QBrush *c,BorderStyle *s,QSize *r)

{
  long lVar1;
  long lVar2;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  lVar1 = 0;
  do {
    QBrush::QBrush((QBrush *)((long)this->borders + lVar1 + 0x14));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  this->radii[2].wd.m_i = -1;
  this->radii[2].ht.m_i = -1;
  this->radii[3].wd.m_i = -1;
  this->radii[3].ht.m_i = -1;
  this->radii[0].wd.m_i = -1;
  this->radii[0].ht.m_i = -1;
  this->radii[1].wd.m_i = -1;
  this->radii[1].ht.m_i = -1;
  (this->bi).d.ptr = (QStyleSheetBorderImageData *)0x0;
  lVar2 = -0x20;
  lVar1 = 0;
  do {
    *(undefined4 *)((long)this->borders + lVar1) = *(undefined4 *)((long)b + lVar1);
    *(undefined4 *)((long)this->styles + lVar1) = *(undefined4 *)((long)s + lVar1);
    QBrush::operator=((QBrush *)((long)this->styles + lVar2),c + lVar2 + 0x20);
    *(undefined8 *)((long)&this->radii[0].wd.m_i + lVar1 * 2) =
         *(undefined8 *)((long)&(r->wd).m_i + lVar1 * 2);
    lVar1 = lVar1 + 4;
    lVar2 = lVar2 + 8;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

QStyleSheetBorderData(int *b, QBrush *c, QCss::BorderStyle *s, QSize *r) : bi(nullptr)
    {
        for (int i = 0; i < 4; i++) {
            borders[i] = b[i];
            styles[i] = s[i];
            colors[i] = c[i];
            radii[i] = r[i];
        }
    }